

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O3

ssize_t decode_length(uint32_t *res,size_t *shift_ptr,int *fin,uint32_t initial,size_t shift,
                     uint8_t *in,uint8_t *last,size_t prefix)

{
  byte *pbVar1;
  ssize_t sVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  
  *shift_ptr = 0;
  *fin = 0;
  pbVar1 = in;
  if (initial == 0) {
    initial = ~(-1 << ((byte)prefix & 0x1f)) & 0xff;
    if ((*in & initial) == initial) {
      pbVar1 = in + 1;
      if (pbVar1 != last) goto LAB_006561e9;
      *res = initial;
    }
    else {
      *res = *in & initial;
      *fin = 1;
    }
    sVar2 = 1;
  }
  else {
LAB_006561e9:
    if (pbVar1 != last) {
      lVar3 = (long)pbVar1 - (long)in;
      do {
        lVar3 = lVar3 + 1;
        if (0x1f < shift) {
          return -1;
        }
        uVar4 = *pbVar1 & 0x7f;
        if (0xffffffffU >> ((byte)shift & 0x1f) < uVar4) {
          return -1;
        }
        uVar4 = uVar4 << ((byte)shift & 0x1f);
        bVar5 = CARRY4(initial,uVar4);
        initial = initial + uVar4;
        if (bVar5) {
          return -1;
        }
        if (-1 < (char)*pbVar1) {
          *shift_ptr = shift;
          *res = initial;
          *fin = 1;
          return lVar3;
        }
        pbVar1 = pbVar1 + 1;
        shift = shift + 7;
      } while (pbVar1 != last);
    }
    *shift_ptr = shift;
    *res = initial;
    sVar2 = (long)last - (long)in;
  }
  return sVar2;
}

Assistant:

static ssize_t decode_length(uint32_t *res, size_t *shift_ptr, int *fin,
                             uint32_t initial, size_t shift, const uint8_t *in,
                             const uint8_t *last, size_t prefix) {
  uint32_t k = (uint8_t)((1 << prefix) - 1);
  uint32_t n = initial;
  const uint8_t *start = in;

  *shift_ptr = 0;
  *fin = 0;

  if (n == 0) {
    if ((*in & k) != k) {
      *res = (*in) & k;
      *fin = 1;
      return 1;
    }

    n = k;

    if (++in == last) {
      *res = n;
      return (ssize_t)(in - start);
    }
  }

  for (; in != last; ++in, shift += 7) {
    uint32_t add = *in & 0x7f;

    if (shift >= 32) {
      DEBUGF("inflate: shift exponent overflow\n");
      return -1;
    }

    if ((UINT32_MAX >> shift) < add) {
      DEBUGF("inflate: integer overflow on shift\n");
      return -1;
    }

    add <<= shift;

    if (UINT32_MAX - add < n) {
      DEBUGF("inflate: integer overflow on addition\n");
      return -1;
    }

    n += add;

    if ((*in & (1 << 7)) == 0) {
      break;
    }
  }

  *shift_ptr = shift;

  if (in == last) {
    *res = n;
    return (ssize_t)(in - start);
  }

  *res = n;
  *fin = 1;
  return (ssize_t)(in + 1 - start);
}